

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void add_name(char *name)

{
  UT_hash_bucket *pUVar1;
  UT_hash_table *pUVar2;
  UT_hash_bucket *__ptr;
  UT_hash_handle *pUVar3;
  UT_hash_handle *pUVar4;
  int __status;
  lookup_t *plVar5;
  size_t sVar6;
  char *pcVar7;
  UT_hash_table *pUVar8;
  UT_hash_bucket *pUVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  UT_hash_handle *pUVar17;
  uint uVar18;
  UT_hash_handle *pUVar19;
  lookup_t *plVar20;
  byte *pbVar21;
  size_t sStack_40;
  
  plVar5 = (lookup_t *)malloc(0x40);
  if (plVar5 == (lookup_t *)0x0) {
    pcVar7 = "couldn\'t get memory for lookup_t\n";
    sStack_40 = 0x21;
  }
  else {
    sVar6 = strlen(name);
    pcVar7 = (char *)malloc(sVar6 * 8 + 8);
    plVar5->name = pcVar7;
    if (pcVar7 != (char *)0x0) {
      strncpy(pcVar7,name,sVar6 + 1);
      pUVar19 = &plVar5->hh;
      (plVar5->hh).next = (void *)0x0;
      (plVar5->hh).key = pcVar7;
      sVar6 = strlen(pcVar7);
      (plVar5->hh).keylen = (uint)sVar6;
      plVar20 = lookup;
      if (lookup == (lookup_t *)0x0) {
        lookup = plVar5;
        (plVar5->hh).prev = (void *)0x0;
        pUVar8 = (UT_hash_table *)calloc(1,0x40);
        (plVar5->hh).tbl = pUVar8;
        if (pUVar8 != (UT_hash_table *)0x0) {
          pUVar8->tail = pUVar19;
          pUVar8->num_buckets = 0x20;
          pUVar8->log2_num_buckets = 5;
          pUVar8->hho = 8;
          pUVar9 = (UT_hash_bucket *)calloc(1,0x200);
          pUVar8->buckets = pUVar9;
          if (pUVar9 != (UT_hash_bucket *)0x0) {
            pUVar8->signature = 0xa0111fe1;
            plVar20 = plVar5;
            goto LAB_00102e0c;
          }
        }
      }
      else {
        pUVar8 = (lookup->hh).tbl;
        pUVar17 = pUVar8->tail;
        pUVar17->next = plVar5;
        (plVar5->hh).prev = (void *)((long)pUVar17 - pUVar8->hho);
        pUVar8->tail = pUVar19;
LAB_00102e0c:
        uVar13 = pUVar8->num_items + 1;
        pUVar8->num_items = uVar13;
        (plVar5->hh).tbl = pUVar8;
        sVar6 = strlen(pcVar7);
        pbVar21 = (byte *)(pcVar7 + 10);
        uVar11 = 0x9e3779b9;
        uVar10 = 0xfeedbeef;
        uVar14 = 0x9e3779b9;
        uVar15 = sVar6 & 0xffffffff;
        while (uVar12 = (uint)uVar15, 0xb < uVar12) {
          uVar10 = uVar10 + *(int *)(pbVar21 + -2);
          uVar16 = uVar10 >> 0xd ^
                   ((uVar14 + *(int *)(pbVar21 + -10)) - (uVar11 + *(int *)(pbVar21 + -6))) - uVar10
          ;
          uVar14 = uVar16 << 8 ^ ((uVar11 + *(int *)(pbVar21 + -6)) - uVar10) - uVar16;
          uVar11 = uVar14 >> 0xd ^ (uVar10 - uVar16) - uVar14;
          uVar10 = uVar11 >> 0xc ^ (uVar16 - uVar14) - uVar11;
          uVar16 = uVar10 << 0x10 ^ (uVar14 - uVar11) - uVar10;
          uVar18 = uVar16 >> 5 ^ (uVar11 - uVar10) - uVar16;
          uVar14 = uVar18 >> 3 ^ (uVar10 - uVar16) - uVar18;
          uVar11 = uVar14 << 10 ^ (uVar16 - uVar18) - uVar14;
          uVar10 = uVar11 >> 0xf ^ (uVar18 - uVar14) - uVar11;
          (plVar5->hh).hashv = uVar10;
          pbVar21 = pbVar21 + 0xc;
          uVar15 = (ulong)(uVar12 - 0xc);
        }
        uVar10 = uVar10 + (int)sVar6;
        switch(uVar12) {
        case 0xb:
          uVar10 = (uint)*pbVar21 * 0x1000000 + uVar10;
          (plVar5->hh).hashv = uVar10;
        case 10:
          uVar10 = (uint)pbVar21[-1] * 0x10000 + uVar10;
        case 9:
          uVar10 = (uint)pbVar21[-2] * 0x100 + uVar10;
          (plVar5->hh).hashv = uVar10;
        case 8:
          uVar11 = (uint)pbVar21[-3] * 0x1000000 + uVar11;
        case 7:
          uVar11 = (uint)pbVar21[-4] * 0x10000 + uVar11;
        case 6:
          uVar11 = (uint)pbVar21[-5] * 0x100 + uVar11;
        case 5:
          uVar11 = pbVar21[-6] + uVar11;
        case 4:
          uVar14 = (uint)pbVar21[-7] * 0x1000000 + uVar14;
        case 3:
          uVar14 = (uint)pbVar21[-8] * 0x10000 + uVar14;
        case 2:
          uVar14 = (uint)pbVar21[-9] * 0x100 + uVar14;
        case 1:
          uVar14 = pbVar21[-10] + uVar14;
        }
        uVar14 = uVar10 >> 0xd ^ (uVar14 - uVar11) - uVar10;
        uVar16 = uVar14 << 8 ^ (uVar11 - uVar10) - uVar14;
        uVar12 = uVar16 >> 0xd ^ (uVar10 - uVar14) - uVar16;
        uVar11 = uVar12 >> 0xc ^ (uVar14 - uVar16) - uVar12;
        uVar10 = uVar11 << 0x10 ^ (uVar16 - uVar12) - uVar11;
        uVar14 = uVar10 >> 5 ^ (uVar12 - uVar11) - uVar10;
        uVar11 = uVar14 >> 3 ^ (uVar11 - uVar10) - uVar14;
        uVar10 = uVar11 << 10 ^ (uVar10 - uVar14) - uVar11;
        uVar10 = uVar10 >> 0xf ^ uVar14 - (uVar11 + uVar10);
        (plVar5->hh).hashv = uVar10;
        pUVar2 = (plVar20->hh).tbl;
        uVar10 = pUVar2->num_buckets - 1 & uVar10;
        pUVar9 = pUVar2->buckets;
        pUVar9[uVar10].count = pUVar9[uVar10].count + 1;
        pUVar17 = pUVar9[uVar10].hh_head;
        (plVar5->hh).hh_next = pUVar17;
        (plVar5->hh).hh_prev = (UT_hash_handle *)0x0;
        if (pUVar17 != (UT_hash_handle *)0x0) {
          pUVar17->hh_prev = pUVar19;
        }
        pUVar9[uVar10].hh_head = pUVar19;
        pUVar9 = ((lookup->hh).tbl)->buckets;
        if ((pUVar9[uVar10].count < pUVar9[uVar10].expand_mult * 10 + 10) || (pUVar8->noexpand == 1)
           ) {
          return;
        }
        uVar10 = pUVar8->num_buckets;
        uVar11 = uVar10 * 2;
        pUVar9 = (UT_hash_bucket *)calloc(1,(ulong)uVar11 << 4);
        if (pUVar9 != (UT_hash_bucket *)0x0) {
          uVar11 = uVar11 - 1;
          uVar13 = ((uVar13 >> ((char)pUVar8->log2_num_buckets + 1U & 0x1f)) + 1) -
                   (uint)((uVar11 & uVar13) == 0);
          pUVar8->ideal_chain_maxlen = uVar13;
          pUVar8->nonideal_items = 0;
          __ptr = pUVar8->buckets;
          uVar14 = 0;
          for (uVar15 = 0; uVar15 != uVar10; uVar15 = uVar15 + 1) {
            pUVar17 = __ptr[uVar15].hh_head;
            while (pUVar17 != (UT_hash_handle *)0x0) {
              pUVar3 = pUVar17->hh_next;
              uVar16 = pUVar17->hashv & uVar11;
              pUVar1 = pUVar9 + uVar16;
              uVar12 = pUVar9[uVar16].count + 1;
              pUVar9[uVar16].count = uVar12;
              if (uVar13 < uVar12) {
                uVar14 = uVar14 + 1;
                pUVar8->nonideal_items = uVar14;
                pUVar1->expand_mult = uVar12 / uVar13;
              }
              pUVar17->hh_prev = (UT_hash_handle *)0x0;
              pUVar4 = pUVar1->hh_head;
              pUVar17->hh_next = pUVar4;
              if (pUVar4 != (UT_hash_handle *)0x0) {
                pUVar4->hh_prev = pUVar17;
              }
              pUVar1->hh_head = pUVar17;
              pUVar17 = pUVar3;
            }
          }
          free(__ptr);
          pUVar8 = pUVar19->tbl;
          pUVar8->num_buckets = pUVar8->num_buckets << 1;
          pUVar8->log2_num_buckets = pUVar8->log2_num_buckets + 1;
          pUVar8->buckets = pUVar9;
          if (pUVar8->num_items >> 1 < pUVar8->nonideal_items) {
            uVar10 = pUVar8->ineff_expands + 1;
            pUVar8->ineff_expands = uVar10;
            if (uVar10 < 2) {
              return;
            }
            pUVar8->noexpand = 1;
            return;
          }
          pUVar8->ineff_expands = 0;
          return;
        }
      }
      __status = -1;
      goto LAB_00103163;
    }
    pcVar7 = "couldn\'t get memory for name string\n";
    sStack_40 = 0x24;
  }
  fwrite(pcVar7,sStack_40,1,_stderr);
  __status = 1;
LAB_00103163:
  exit(__status);
}

Assistant:

void add_name(char *name)
{
	lookup_t *s;
	s = (lookup_t *)malloc(sizeof(lookup_t));
	if (s == NULL) {
		fprintf(stderr,"couldn't get memory for lookup_t\n");
		exit(EXIT_FAILURE);
	} else {
		s->name = NULL;
	}
	s->name = (char *)malloc(sizeof(char *) * (strlen(name)+1));
	if (s->name == NULL) {
		fprintf(stderr,"couldn't get memory for name string\n");
		exit(EXIT_FAILURE);
	}
	strncpy(s->name,name,strlen(name)+1);

	HASH_ADD_KEYPTR( hh, lookup, s->name, strlen(s->name), s );
}